

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

arena_t * arena_init(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks)

{
  arena_t *paVar1;
  extent_hooks_t *in_RDX;
  uint in_ESI;
  tsdn_t *in_RDI;
  arena_t *arena;
  tsdn_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff0;
  
  malloc_mutex_lock(in_RDI,(malloc_mutex_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  paVar1 = arena_init_locked(in_RDI,in_ESI,in_RDX);
  malloc_mutex_unlock((tsdn_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(malloc_mutex_t *)in_RDX)
  ;
  arena_new_create_background_thread(in_stack_ffffffffffffffd8,0);
  return paVar1;
}

Assistant:

arena_t *
arena_init(tsdn_t *tsdn, unsigned ind, extent_hooks_t *extent_hooks) {
	arena_t *arena;

	malloc_mutex_lock(tsdn, &arenas_lock);
	arena = arena_init_locked(tsdn, ind, extent_hooks);
	malloc_mutex_unlock(tsdn, &arenas_lock);

	arena_new_create_background_thread(tsdn, ind);

	return arena;
}